

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSplitter::ClearFreeMemory(ImDrawListSplitter *this)

{
  ImDrawChannel *pIVar1;
  int local_14;
  int i;
  ImDrawListSplitter *this_local;
  
  for (local_14 = 0; local_14 < (this->_Channels).Size; local_14 = local_14 + 1) {
    if (local_14 == this->_Current) {
      pIVar1 = ImVector<ImDrawChannel>::operator[]
                         ((ImVector<ImDrawChannel> *)&this->_Channels,local_14);
      memset(pIVar1,0,0x20);
    }
    pIVar1 = ImVector<ImDrawChannel>::operator[]
                       ((ImVector<ImDrawChannel> *)&this->_Channels,local_14);
    ImVector<ImDrawCmd>::clear((ImVector<ImDrawCmd> *)pIVar1);
    pIVar1 = ImVector<ImDrawChannel>::operator[]
                       ((ImVector<ImDrawChannel> *)&this->_Channels,local_14);
    ImVector<unsigned_short>::clear((ImVector<unsigned_short> *)&pIVar1->_IdxBuffer);
  }
  this->_Current = 0;
  this->_Count = 1;
  ImVector<ImDrawChannel>::clear((ImVector<ImDrawChannel> *)&this->_Channels);
  return;
}

Assistant:

void ImDrawListSplitter::ClearFreeMemory()
{
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == _Current)
            memset(&_Channels[i], 0, sizeof(_Channels[i]));  // Current channel is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i]._CmdBuffer.clear();
        _Channels[i]._IdxBuffer.clear();
    }
    _Current = 0;
    _Count = 1;
    _Channels.clear();
}